

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  pointer pcVar1;
  pointer ppcVar2;
  cmTestGenerator *this_00;
  undefined8 uVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  string *psVar9;
  char *__s;
  cmMakefile *pcVar10;
  string *i;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar11;
  pointer ppcVar12;
  pointer this_01;
  string outP;
  string parentBinDir;
  string file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  cmGeneratedFileStream fout;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  string local_360;
  cmStateSnapshot *local_340;
  undefined1 local_338 [16];
  undefined1 local_328 [24];
  string local_310;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_2f0;
  string local_2d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  string local_298;
  undefined1 local_278 [584];
  
  pcVar10 = this->Makefile;
  local_380._24_8_ = this;
  local_278._0_8_ = local_278 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_TESTING_ENABLED","");
  bVar4 = cmMakefile::IsOn(pcVar10,(string *)local_278);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  uVar3 = local_380._24_8_;
  if (!bVar4) {
    return;
  }
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::GetConfigurations
            (&local_2d8,*(cmMakefile **)(local_380._24_8_ + 0x28),&local_2b8,false);
  local_340 = (cmStateSnapshot *)(uVar3 + 0x30);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_278,local_340);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_278);
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_328 + 0x18),pcVar1,pcVar1 + psVar5->_M_string_length);
  std::__cxx11::string::append(local_328 + 0x18);
  std::__cxx11::string::append(local_328 + 0x18);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(string *)(local_328 + 0x18),false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"# CMake generated Testfile for ",0x1f);
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"# Source directory: ",0x14);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_390,local_340);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_390);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"# Build directory: ",0x13);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_338,local_340);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_338);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"# ",2);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"# This file includes the relevant testing commands ",0x33);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"required for ",0xd);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"# testing this directory and lists subdirectories to ",0x35);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"be tested as well.",0x12);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  local_390._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"TEST_INCLUDE_FILE","");
  pcVar7 = cmMakefile::GetProperty(pcVar10,(string *)local_390);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
    operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
  }
  if (pcVar7 != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
    sVar8 = strlen(pcVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar7,sVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\")",2);
    std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    std::ostream::flush();
  }
  pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  local_390._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"TEST_INCLUDE_FILES","");
  pcVar7 = cmMakefile::GetProperty(pcVar10,(string *)local_390);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
    operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
  }
  if (pcVar7 != (char *)0x0) {
    local_338._0_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
    local_338._8_8_ = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
    local_328._0_8_ = (cmState *)0x0;
    local_390._0_8_ = local_380;
    sVar8 = strlen(pcVar7);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_390,pcVar7,pcVar7 + sVar8);
    cmSystemTools::ExpandListArgument
              ((string *)local_390,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_338,false);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
    }
    uVar3 = local_338._8_8_;
    if (local_338._0_8_ != local_338._8_8_) {
      pcVar11 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_338._0_8_;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"include(\"",9);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_278,
                            (char *)(pcVar11->Data).
                                    super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            (long)(pcVar11->Data).
                                  super__Vector_base<cmStateDetail::BuildsystemDirectoryStateType,_std::allocator<cmStateDetail::BuildsystemDirectoryStateType>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")",2);
        std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pcVar11 = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)
                  &(pcVar11->UpPositions).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      } while (pcVar11 != (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)uVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_338);
  }
  pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  ppcVar12 = (pcVar10->TestGenerators).
             super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (pcVar10->TestGenerators).
            super__Vector_base<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar12 != ppcVar2) {
    do {
      this_00 = *ppcVar12;
      cmTestGenerator::Compute(this_00,(cmLocalGenerator *)local_380._24_8_);
      cmScriptGenerator::Generate
                (&this_00->super_cmScriptGenerator,(ostream *)local_278,&local_2d8,&local_2b8);
      ppcVar12 = ppcVar12 + 1;
    } while (ppcVar12 != ppcVar2);
    pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  }
  cmMakefile::GetStateSnapshot(pcVar10);
  cmStateSnapshot::GetChildren(&local_2f0,(cmStateSnapshot *)local_390);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_390,local_340);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_390);
  local_338._0_8_ = local_328;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_338,pcVar1,pcVar1 + psVar5->_M_string_length);
  if (local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar5 = (string *)(local_380 + 0x20);
    this_01 = local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_390,this_01);
      psVar9 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)local_390);
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      pcVar1 = (psVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)psVar5,pcVar1,pcVar1 + psVar9->_M_string_length);
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_390,local_340);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_298,(cmStateDirectory *)local_390,(string *)local_338,psVar5);
      std::__cxx11::string::operator=((string *)psVar5,(string *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      cmOutputConverter::EscapeForCMake((string *)local_390,psVar5);
      std::__cxx11::string::operator=((string *)psVar5,(string *)local_390);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"subdirs(",8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_278,local_360._M_dataplus._M_p,local_360._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      this_01 = this_01 + 1;
    } while (this_01 !=
             local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  local_390._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"CMAKE_DIRECTORY_LABELS","");
  pcVar7 = cmMakefile::GetDefinition(pcVar10,(string *)local_390);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
    operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
  }
  pcVar10 = *(cmMakefile **)(local_380._24_8_ + 0x28);
  local_390._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"LABELS","");
  __s = cmMakefile::GetProperty(pcVar10,(string *)local_390);
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
    operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
  }
  if (pcVar7 == (char *)0x0 && __s == (char *)0x0) goto LAB_00309664;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_278,"set_directory_properties(PROPERTIES LABELS ",0x2b);
  if (__s == (char *)0x0) {
    if (pcVar7 != (char *)0x0) goto LAB_0030959a;
  }
  else {
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    sVar8 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)(local_380 + 0x20),__s,__s + sVar8);
    cmOutputConverter::EscapeForCMake((string *)local_390,(string *)(local_380 + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,(char *)local_390._0_8_,local_390._8_8_);
    if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
        (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if (pcVar7 != (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,";",1);
LAB_0030959a:
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      sVar8 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)(local_380 + 0x20),pcVar7,pcVar7 + sVar8);
      cmOutputConverter::EscapeForCMake((string *)local_390,(string *)(local_380 + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,(char *)local_390._0_8_,local_390._8_8_);
      if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_390._0_8_ !=
          (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_380) {
        operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,")",1);
  std::ios::widen((char)(ostream *)local_278 + (char)*(undefined8 *)(local_278._0_8_ + -0x18));
  std::ostream::put((char)local_278);
  std::ostream::flush();
LAB_00309664:
  if ((cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_338._0_8_ !=
      (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)local_328) {
    operator_delete((void *)local_338._0_8_,(ulong)(local_328._0_8_ + 1));
  }
  if (local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
      super__Vector_impl_data._M_start != (cmStateSnapshot *)0x0) {
    operator_delete(local_2f0.super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file);
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::string const& i : includesList) {
      fout << "include(\"" << i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (cmTestGenerator* tester : testers) {
    tester->Compute(this);
    tester->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (cmStateSnapshot const& i : children) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i.GetDirectory().GetCurrentBinary();
    outP = this->MaybeConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}